

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglColorClearCase.cpp
# Opt level: O0

void deqp::egl::readPixels(EGLint api,ApiFunctions *func,Surface *dst)

{
  int iVar1;
  int iVar2;
  Surface *dst_local;
  ApiFunctions *func_local;
  EGLint api_local;
  
  if (api == 1) {
    iVar1 = tcu::Surface::getWidth(dst);
    iVar2 = tcu::Surface::getHeight(dst);
    gles1::readPixels(dst,0,0,iVar1,iVar2);
  }
  else if (api == 2) {
    iVar1 = tcu::Surface::getWidth(dst);
    iVar2 = tcu::Surface::getHeight(dst);
    vg::readPixels(dst,0,0,iVar1,iVar2);
  }
  else if (api == 4) {
    iVar1 = tcu::Surface::getWidth(dst);
    iVar2 = tcu::Surface::getHeight(dst);
    gles2::readPixels(&func->gl,dst,0,0,iVar1,iVar2);
  }
  else if (api == 0x40) {
    iVar1 = tcu::Surface::getWidth(dst);
    iVar2 = tcu::Surface::getHeight(dst);
    gles2::readPixels(&func->gl,dst,0,0,iVar1,iVar2);
  }
  return;
}

Assistant:

static void readPixels (EGLint api, const ApiFunctions& func, tcu::Surface& dst)
{
	switch (api)
	{
		case EGL_OPENGL_ES_BIT:			gles1::readPixels	(dst, 0, 0, dst.getWidth(), dst.getHeight());			break;
		case EGL_OPENGL_ES2_BIT:		gles2::readPixels	(func.gl, dst, 0, 0, dst.getWidth(), dst.getHeight());	break;
		case EGL_OPENGL_ES3_BIT_KHR:	gles2::readPixels	(func.gl, dst, 0, 0, dst.getWidth(), dst.getHeight());	break;
		case EGL_OPENVG_BIT:			vg::readPixels		(dst, 0, 0, dst.getWidth(), dst.getHeight());			break;
		default:
			DE_ASSERT(DE_FALSE);
	}
}